

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O0

void __thiscall
kj::_::LogExpectation::logMessage
          (LogExpectation *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  int contextDepth_00;
  int line_00;
  char *file_00;
  LogSeverity severity_00;
  bool bVar1;
  String *text_00;
  ArrayPtr<const_char> local_40;
  String *local_30;
  String *text_local;
  int contextDepth_local;
  int line_local;
  char *file_local;
  LogExpectation *pLStack_10;
  LogSeverity severity_local;
  LogExpectation *this_local;
  
  local_30 = text;
  text_local._0_4_ = contextDepth;
  text_local._4_4_ = line;
  _contextDepth_local = file;
  file_local._4_4_ = severity;
  pLStack_10 = this;
  if (((this->seen & 1U) == 0) && (severity == this->severity)) {
    StringPtr::StringPtr((StringPtr *)&local_40,text);
    bVar1 = hasSubstring((StringPtr)local_40,(StringPtr)(this->substring).content);
    if (bVar1) {
      this->seen = true;
      return;
    }
  }
  severity_00 = file_local._4_4_;
  file_00 = _contextDepth_local;
  line_00 = text_local._4_4_;
  contextDepth_00 = (int)text_local;
  text_00 = mv<kj::String>(local_30);
  ExceptionCallback::logMessage
            (&this->super_ExceptionCallback,severity_00,file_00,line_00,contextDepth_00,text_00);
  return;
}

Assistant:

void LogExpectation::logMessage(
    LogSeverity severity, const char* file, int line, int contextDepth,
    String&& text) {
  if (!seen && severity == this->severity) {
    if (hasSubstring(text, substring)) {
      // Match. Ignore it.
      seen = true;
      return;
    }
  }

  // Pass up the chain.
  ExceptionCallback::logMessage(severity, file, line, contextDepth, kj::mv(text));
}